

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bool __thiscall ecjacobian::calcy(ecjacobian *this,bool ybit)

{
  char extraout_AL;
  gfield *pgVar1;
  bigint<13> *y;
  double __x;
  gfield tmp;
  gfield y2;
  bigint<26> local_80;
  bigint<13> local_48;
  
  bigint<26>::mul<13,13>(&local_80,(bigint<13> *)this,(bigint<13> *)this);
  gfield::reduce<26>((gfield *)&local_48,&local_80);
  bigint<26>::mul<13,13>(&local_80,&local_48,(bigint<13> *)this);
  gfield::reduce<26>((gfield *)&local_48,&local_80);
  pgVar1 = gfield::add<13,13>((gfield *)&local_80,(bigint<13> *)this,(bigint<13> *)this);
  y = &gfield::add<13,13>(pgVar1,&pgVar1->super_gfint,(bigint<13> *)this)->super_gfint;
  pgVar1 = gfield::sub<13,13>((gfield *)&local_48,&local_48,y);
  gfield::add<13,13>(pgVar1,&pgVar1->super_gfint,&B.super_gfint);
  pgVar1 = &this->y;
  gfield::sqrt(pgVar1,__x);
  if (extraout_AL == '\0') {
    (pgVar1->super_gfint).len = 0;
  }
  else if ((bool)((byte)(this->y).super_gfint.digits[0] & 0 < (this->y).super_gfint.len) != ybit) {
    bigint<13>::sub<13,13>(&pgVar1->super_gfint,&gfield::P.super_gfint,&pgVar1->super_gfint);
  }
  return (bool)extraout_AL;
}

Assistant:

bool calcy(bool ybit)
    {
        gfield y2, tmp;
        y2.square(x).mul(x).sub(tmp.add(x, x).add(x)).add(B);
        if(!y.sqrt(y2)) { y.zero(); return false; }
        if(y.hasbit(0) != ybit) y.neg();
        return true;
    }